

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O3

void __thiscall PacketProcessor::feed(PacketProcessor *this,void *d,size_t size)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  int iVar3;
  long lVar4;
  pthread_mutex_t *__mutex;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  pointer puVar8;
  ulong uVar9;
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  if (size == 0) {
    return;
  }
  this_00 = &this->buffer_;
  puVar8 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar8 == puVar2) {
LAB_00103c18:
    uVar9 = 1;
    lVar4 = 0;
    do {
      if (*(char *)((long)d + (uVar9 - 1)) == 'Z') {
        if (size <= uVar9) {
          __position._M_current =
               (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            *__position._M_current = 'Z';
            ppuVar1 = &(this->buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
            return;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,
                     (uchar *)((long)d - lVar4));
          return;
        }
        if (*(char *)((long)d + uVar9) == -0x5b) {
          puVar8 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = (long)(this->buffer_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar8;
          lVar4 = -lVar4;
          goto LAB_00103c71;
        }
      }
      lVar4 = lVar4 + -1;
      uVar9 = uVar9 + 1;
    } while (-lVar4 != size);
  }
  else {
    lVar7 = (long)puVar2 - (long)puVar8;
    if (lVar7 == 1) {
      if (*puVar8 != 'Z') {
        __assert_fail("buffer_[0] == H_1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                      ,0x7b,"void PacketProcessor::feed(const void *, size_t)");
      }
      if (*d != -0x5b) {
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar8;
        if ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != puVar8) {
          std::__shrink_to_fit_aux<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true>
          ::_S_do_it(this_00);
        }
        goto LAB_00103c18;
      }
      lVar7 = 1;
    }
    lVar4 = 0;
LAB_00103c71:
    uVar9 = (size - lVar4) + lVar7;
    if (this->maxBufferSize_ < uVar9) {
      __mutex = (pthread_mutex_t *)L_O_G_NS_MUTEX::mutex();
      iVar3 = pthread_mutex_lock(__mutex);
      if (iVar3 == 0) {
        L_O_G_NS_GET_TIME::get_time_abi_cxx11_();
        uVar5 = syscall(0xba);
        printf("\x1b[35m%s %u [W]: %s:%d [%s] size too big, need: %zu, max: %zu\x1b[m\n",local_50,
               uVar5 & 0xffffffff,"PacketProcessor.cpp",0x87,"feed",uVar9,
               (ulong)this->maxBufferSize_);
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        pthread_mutex_unlock(__mutex);
        puVar8 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        this->findHeader_ = false;
        this->dataSize_ = 0;
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (puVar8 != (pointer)0x0) {
          operator_delete(puVar8);
        }
        return;
      }
      uVar6 = std::__throw_system_error(iVar3);
      pthread_mutex_unlock(__mutex);
      _Unwind_Resume(uVar6);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,puVar8 + lVar7,
               (long)d + lVar4,(long)d + (size - lVar4));
  }
  tryUnpack(this);
  return;
}

Assistant:

void PacketProcessor::feed(const void* d, size_t size) {
  const uint8_t* data = (uint8_t*)d;
  if (size == 0) return;
  PacketProcessor_LOGV("feed: %u", size);

  // 缓存数据(当遇到包头后才开始缓存)
  size_t startPos = 0;
  if (buffer_.empty()) {
  START_HEADER:
    FOR(i, size) {
      if (data[i] == H_1) {
        if (i + 1 < size) {
          if (data[i + 1] == H_2) {
            startPos = i;
            goto START_BUFFER;
          } else {
            continue;
          }
        } else {
          buffer_.push_back(data[i]);
          return;
        }
      }
    }
  } else if (buffer_.size() == 1) {
    assert(buffer_[0] == H_1);
    if (data[0] == H_2)
      goto START_BUFFER;
    else {
      buffer_.clear();
      buffer_.shrink_to_fit();
      goto START_HEADER;
    }
  } else {
  START_BUFFER:
    const auto needSize = buffer_.size() + size - startPos;
    if (needSize > maxBufferSize_) {
      PacketProcessor_LOGW("size too big, need: %zu, max: %zu", needSize, (size_t)maxBufferSize_);
      clearBuffer();
      return;
    }
    buffer_.insert(buffer_.end(), data + startPos, data + size - startPos);
  }

  // 尝试解包
  tryUnpack();
}